

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

void cea708_parse_user_data_type_strcture(uint8_t *data,size_t size,user_data_t *user_data)

{
  byte bVar1;
  cc_data_t cVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  bool bVar8;
  
  memset(user_data,0,0x84);
  bVar1 = *data;
  *(ushort *)user_data = (ushort)(bVar1 >> 7);
  uVar4 = *data >> 5 & 2 | (ushort)(bVar1 >> 7);
  *(ushort *)user_data = uVar4;
  uVar4 = *data >> 3 & 4 | uVar4;
  *(ushort *)user_data = uVar4;
  bVar1 = *data;
  bVar3 = (byte)uVar4 | bVar1 << 3;
  *(ushort *)user_data = (ushort)bVar3;
  *(ushort *)user_data = CONCAT11(data[1],bVar3);
  if ((bVar1 & 0x1f) != 0 && 3 < size - 2) {
    pbVar7 = data + 2;
    uVar6 = size - 5;
    uVar5 = 1;
    do {
      bVar3 = *pbVar7;
      cVar2 = user_data->cc_data[uVar5 - 1];
      user_data->cc_data[uVar5 - 1] = (cc_data_t)((uint)cVar2 & 0xffffffe0 | (uint)(bVar3 >> 3));
      cVar2 = (cc_data_t)(((uint)cVar2 & 0xffffffc0 | (uint)(bVar3 >> 3)) + (*pbVar7 & 4) * 8);
      user_data->cc_data[uVar5 - 1] = cVar2;
      bVar3 = *pbVar7;
      user_data->cc_data[uVar5 - 1] =
           (cc_data_t)((uint)cVar2 & 0xffffff3f | (uint)(byte)(bVar3 << 6));
      user_data->cc_data[uVar5 - 1] =
           (cc_data_t)
           ((uint)cVar2 & 0xff00003f | (uint)(byte)(bVar3 << 6) |
           (uint)pbVar7[2] << 8 | (uint)pbVar7[1] << 0x10);
      if (uVar6 < 4) {
        return;
      }
      uVar6 = uVar6 - 3;
      pbVar7 = pbVar7 + 3;
      bVar8 = uVar5 < (bVar1 & 0x1f);
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  return;
}

Assistant:

void cea708_parse_user_data_type_strcture(const uint8_t* data, size_t size, user_data_t* user_data)
{
    memset(user_data, 0, sizeof(user_data_t));
    user_data->process_em_data_flag = !!(data[0] & 0x80);
    user_data->process_cc_data_flag = !!(data[0] & 0x40);
    user_data->additional_data_flag = !!(data[0] & 0x20);
    user_data->cc_count = (data[0] & 0x1F);
    user_data->em_data = data[1];
    data += 2, size -= 2;

    for (int i = 0; 3 < size && i < (int)user_data->cc_count; ++i, data += 3, size -= 3) {
        user_data->cc_data[i].marker_bits = data[0] >> 3;
        user_data->cc_data[i].cc_valid = data[0] >> 2;
        user_data->cc_data[i].cc_type = data[0] >> 0;
        user_data->cc_data[i].cc_data = data[1] << 8 | data[2];
    }
}